

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O2

void __thiscall Am_Data_Locator::Remove_Search_Directory(Am_Data_Locator *this,Am_Filename *dir)

{
  _List_node_base *p_Var1;
  _List_iterator<std::pair<Am_Filename,_unsigned_int>_> _Var2;
  ostream *poVar3;
  string local_40 [32];
  
  _Var2._M_node =
       (this->search_list).
       super__List_base<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string(local_40,(string *)dir);
  _Var2 = std::find_if<std::_List_iterator<std::pair<Am_Filename,unsigned_int>>,search_pred>
                    (_Var2,(_List_iterator<std::pair<Am_Filename,_unsigned_int>_>)this,
                     (search_pred *)local_40);
  std::__cxx11::string::~string(local_40);
  if (_Var2._M_node == (_List_node_base *)this) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Am_Data_Locator: removing search path ");
    std::operator<<(poVar3,(string *)dir);
    poVar3 = std::operator<<(poVar3," absent from search list");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    p_Var1 = _Var2._M_node + 3;
    *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + -1;
    if (*(int *)&p_Var1->_M_next == 0) {
      std::__cxx11::
      list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
      ::erase(&this->search_list,(const_iterator)_Var2._M_node);
    }
  }
  return;
}

Assistant:

void
Am_Data_Locator::Remove_Search_Directory(const Am_Filename &dir)
{
  dir_list_t::iterator it =
      std::find_if(search_list.begin(), search_list.end(), search_pred(dir));
  if (it != search_list.end()) {
    // Decreases the reference count of the directory
    --((*it).second);
    if ((*it).second == 0)
      search_list.erase(it); // and even deletes it if we reach 0
  } else
    std::cout << "Am_Data_Locator: removing search path " << dir
              << " absent from search list" << std::endl;
  return;
}